

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# brotli_hash.h
# Opt level: O2

void duckdb_brotli::InitializeH6(HasherCommon *common,H6 *self,BrotliEncoderParams *params)

{
  undefined4 uVar1;
  undefined4 uVar2;
  uint32_t *puVar3;
  size_t sVar4;
  
  self->common_ = common;
  self->hash_mul_ = 0x7bd3579bd3000000;
  self->bucket_size_ = 1L << ((byte)(common->params).bucket_bits & 0x3f);
  uVar1 = (common->params).block_bits;
  uVar2 = (common->params).num_last_distances_to_check;
  sVar4 = 1L << ((byte)uVar1 & 0x3f);
  self->block_size_ = sVar4;
  self->block_mask_ = (int)sVar4 - 1;
  self->block_bits_ = uVar1;
  self->num_last_distances_to_check_ = uVar2;
  puVar3 = (uint32_t *)common->extra[1];
  self->num_ = (uint16_t *)common->extra[0];
  self->buckets_ = puVar3;
  return;
}

Assistant:

static void FN(Initialize)(
    HasherCommon* common, HashLongestMatch* BROTLI_RESTRICT self,
    const BrotliEncoderParams* params) {
  self->common_ = common;

  BROTLI_UNUSED(params);
  self->hash_mul_ = kHashMul64 << (64 - 5 * 8);
  BROTLI_DCHECK(common->params.bucket_bits == 15);
  self->bucket_size_ = (size_t)1 << common->params.bucket_bits;
  self->block_bits_ = common->params.block_bits;
  self->block_size_ = (size_t)1 << common->params.block_bits;
  self->block_mask_ = (uint32_t)(self->block_size_ - 1);
  self->num_last_distances_to_check_ =
      common->params.num_last_distances_to_check;
  self->num_ = (uint16_t*)common->extra[0];
  self->buckets_ = (uint32_t*)common->extra[1];
}